

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpdat(fitsfile *fptr,int *status)

{
  int *in_RSI;
  char card [81];
  char tmzone [10];
  char date [30];
  int timeref;
  char acStackY_a8 [8];
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  char local_52 [10];
  char local_48 [44];
  int local_1c;
  int *local_18;
  int local_4;
  
  if (*in_RSI < 1) {
    local_18 = in_RSI;
    ffgstm((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (local_1c == 0) {
      strcpy(local_52," UT");
    }
    else {
      strcpy(local_52," Local");
    }
    strcpy(acStackY_a8,"DATE    = \'");
    strcat(acStackY_a8,local_48);
    strcat(acStackY_a8,"\' / file creation date (YYYY-MM-DDThh:mm:ss");
    strcat(acStackY_a8,local_52);
    strcat(acStackY_a8,")");
    ffucrd(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
           (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    local_4 = *local_18;
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffpdat( fitsfile *fptr,      /* I - FITS file pointer  */
            int   *status)       /* IO - error status      */
/*
  Write the DATE keyword into the FITS header.  If the keyword already
  exists then the date will simply be updated in the existing keyword.
*/
{
    int timeref;
    char date[30], tmzone[10], card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffgstm(date, &timeref, status);

    if (timeref)           /* GMT not available on this machine */
        strcpy(tmzone, " Local");    
    else
        strcpy(tmzone, " UT");    

    strcpy(card, "DATE    = '");
    strcat(card, date);
    strcat(card, "' / file creation date (YYYY-MM-DDThh:mm:ss");
    strcat(card, tmzone);
    strcat(card, ")");

    ffucrd(fptr, "DATE", card, status);

    return(*status);
}